

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

void MARGINAL::undo_marginal(data *sm,example *ec)

{
  byte bVar1;
  long lVar2;
  features *pfVar3;
  undefined8 *puVar4;
  features *pfVar5;
  features *pfVar6;
  byte *pbVar7;
  undefined8 local_88 [13];
  
  for (pbVar7 = (ec->super_example_predict).indices._begin;
      pbVar7 != (ec->super_example_predict).indices._end; pbVar7 = pbVar7 + 1) {
    bVar1 = *pbVar7;
    if (sm->id_features[bVar1] == true) {
      pfVar6 = (ec->super_example_predict).feature_space + bVar1;
      pfVar3 = sm->temp + bVar1;
      puVar4 = local_88;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = (pfVar3->values)._begin;
        pfVar3 = (features *)&(pfVar3->values)._end;
        puVar4 = puVar4 + 1;
      }
      pfVar3 = pfVar6;
      pfVar5 = sm->temp + bVar1;
      for (lVar2 = 100; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined1 *)&(pfVar5->values)._begin = *(undefined1 *)&(pfVar3->values)._begin;
        pfVar3 = (features *)((long)&(pfVar3->values)._begin + 1);
        pfVar5 = (features *)((long)&(pfVar5->values)._begin + 1);
      }
      puVar4 = local_88;
      for (lVar2 = 100; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined1 *)&(pfVar6->values)._begin = *(undefined1 *)puVar4;
        puVar4 = (undefined8 *)((long)puVar4 + 1);
        pfVar6 = (features *)((long)&(pfVar6->values)._begin + 1);
      }
    }
  }
  return;
}

Assistant:

void undo_marginal(data& sm, example& ec)
{
  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
      std::swap(sm.temp[n], *i);
  }
}